

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

void __thiscall
cmServerProtocol1::GeneratorInformation::SetupGenerator
          (GeneratorInformation *this,cmake *cm,string *errorMessage)

{
  undefined8 errorMessage_00;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  cmGlobalGenerator *local_58;
  cmGlobalGenerator *gg;
  undefined1 local_40 [8];
  string fullGeneratorName;
  string *errorMessage_local;
  cmake *cm_local;
  GeneratorInformation *this_local;
  
  fullGeneratorName.field_2._8_8_ = errorMessage;
  cmExternalMakefileProjectGenerator::CreateFullGeneratorName
            ((string *)local_40,&this->GeneratorName,&this->ExtraGeneratorName);
  cmake::SetHomeDirectory(cm,&this->SourceDirectory);
  cmake::SetHomeOutputDirectory(cm,&this->BuildDirectory);
  local_58 = cmake::CreateGlobalGenerator(cm,(string *)local_40);
  errorMessage_00 = fullGeneratorName.field_2._8_8_;
  if (local_58 == (cmGlobalGenerator *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"Could not set up the requested combination of \"",&local_f9);
    std::operator+(&local_d8,&local_f8,&kGENERATOR_KEY_abi_cxx11_);
    std::operator+(&local_b8,&local_d8,"\" and \"");
    std::operator+(&local_98,&local_b8,&kEXTRA_GENERATOR_KEY_abi_cxx11_);
    std::operator+(&local_78,&local_98,"\"");
    setErrorMessage((string *)errorMessage_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
  }
  else {
    cmake::SetGlobalGenerator(cm,local_58);
    cmake::SetGeneratorToolset(cm,&this->Toolset);
    cmake::SetGeneratorPlatform(cm,&this->Platform);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmServerProtocol1::GeneratorInformation::SetupGenerator(
  cmake* cm, std::string* errorMessage)
{
  const std::string fullGeneratorName =
    cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
      GeneratorName, ExtraGeneratorName);

  cm->SetHomeDirectory(SourceDirectory);
  cm->SetHomeOutputDirectory(BuildDirectory);

  cmGlobalGenerator* gg = cm->CreateGlobalGenerator(fullGeneratorName);
  if (!gg) {
    setErrorMessage(
      errorMessage,
      std::string("Could not set up the requested combination of \"") +
        kGENERATOR_KEY + "\" and \"" + kEXTRA_GENERATOR_KEY + "\"");
    return;
  }

  cm->SetGlobalGenerator(gg);

  cm->SetGeneratorToolset(Toolset);
  cm->SetGeneratorPlatform(Platform);
}